

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

string * __thiscall
pbrt::syntactic::Material::toString_abi_cxx11_(string *__return_storage_ptr__,Material *this)

{
  char cVar1;
  string *psVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  _Self __tmp;
  _Rb_tree_header *p_Var5;
  stringstream ss;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Material type=\'",0xf);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(this->type)._M_dataplus._M_p,
                      (this->type)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' {",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  p_Var4 = (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header;
  local_1c0 = __return_storage_ptr__;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," - ",3);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," : ",3);
      (**(code **)(**(long **)(p_Var4 + 2) + 0x10))(&local_1e0);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(char *)local_1e0,local_1d8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if (local_1e0 != local_1d0) {
        operator_delete(local_1e0,local_1d0[0] + 1);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}",1);
  psVar2 = local_1c0;
  cVar1 = (char)(ostream *)local_1a8;
  std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string Material::toString() const
    {
      std::stringstream ss;
      ss << "Material type='"<< type << "' {" << std::endl;
      for (std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.begin(); 
           it != param.end(); it++) {
        ss << " - " << it->first << " : " << it->second->toString() << std::endl;
      }
      ss << "}" << std::endl;
      return ss.str();
    }